

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_Constractor1_Test::TestBody(ConfidentialTxIn_Constractor1_Test *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  string local_350;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_5;
  ConfidentialTxIn txin2;
  ConfidentialTxIn txin1;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin1,&exp_txid,2,0xfffffffe);
  gtest_ar_3._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin1.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&txin2,"txin1.GetVout()","exp_index",(uint *)&gtest_ar_3,&exp_index);
  if ((char)txin2.super_AbstractTxIn._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (txin2.super_AbstractTxIn.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var1 = (_func_int *)0x4d37ee;
    }
    else {
      p_Var1 = *txin2.super_AbstractTxIn.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x47,(char *)p_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_350,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txin2.super_AbstractTxIn.txid_);
  gtest_ar_3._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin1.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&txin2,"txin1.GetSequence()","exp_sequence",(uint *)&gtest_ar_3,
             &exp_sequence);
  if ((char)txin2.super_AbstractTxIn._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (txin2.super_AbstractTxIn.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var1 = (_func_int *)0x4d37ee;
    }
    else {
      p_Var1 = *txin2.super_AbstractTxIn.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x48,(char *)p_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_350,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txin2.super_AbstractTxIn.txid_);
  cfd::core::AbstractTxIn::GetTxid((Txid *)&gtest_ar_3,&txin1.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&txin2,(Txid *)&gtest_ar_3);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_350,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin1.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)CONCAT71(txin2.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                              (char)txin2.super_AbstractTxIn._vptr_AbstractTxIn),
             (char *)CONCAT44(local_350._M_dataplus._M_p._4_4_,(uint32_t)local_350._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&txin2);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar_3);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&txin2);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&txin2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin2,&exp_txid,2,0xfffffffe,&exp_script);
  local_350._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin2.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_3,"txin2.GetVout()","exp_index",(uint *)&local_350,&exp_index);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_350);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  local_350._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin2.super_AbstractTxIn)
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_3,"txin2.GetSequence()","exp_sequence",(uint *)&local_350,
             &exp_sequence);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_350);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::AbstractTxIn::GetTxid((Txid *)&local_350,&txin2.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_3,(Txid *)&local_350);
  pcVar2 = (char *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_2,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_5,"txin2.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar2,(char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::Txid::~Txid((Txid *)&local_350);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_350,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)&gtest_ar_3,&txin2.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_(&local_350,(Script *)&gtest_ar_3);
  pcVar2 = (char *)CONCAT44(local_350._M_dataplus._M_p._4_4_,(uint32_t)local_350._M_dataplus._M_p);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_2,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_5,"txin2.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,
             (char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_350);
  cfd::core::Script::~Script((Script *)&gtest_ar_3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_350,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin2);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin1);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor1) {
  ConfidentialTxIn txin1(exp_txid, exp_index, exp_sequence);
  EXPECT_EQ(txin1.GetVout(), exp_index);
  EXPECT_EQ(txin1.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin1.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());

  ConfidentialTxIn txin2(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_EQ(txin2.GetVout(), exp_index);
  EXPECT_EQ(txin2.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin2.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin2.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
}